

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

char * corpus_utt_brief_name(void)

{
  size_t sVar1;
  int iVar2;
  bool local_19;
  int local_18;
  int local_14;
  int i;
  int need_slash;
  
  local_14 = 2;
  if ((cur_ctl_path == (char *)0x0) || (sVar1 = strlen(cur_ctl_path), sVar1 == 0)) {
    _i = "N/A";
  }
  else {
    sVar1 = strlen(cur_ctl_path);
    iVar2 = (int)sVar1;
    do {
      local_18 = iVar2;
      iVar2 = local_18 + -1;
      if (cur_ctl_path[iVar2] == '/') {
        local_14 = local_14 + -1;
      }
      local_19 = 0 < iVar2 && local_14 != 0;
    } while (local_19);
    if (iVar2 == 0) {
      _i = cur_ctl_path;
    }
    else {
      _i = cur_ctl_path + local_18;
    }
  }
  return _i;
}

Assistant:

char *corpus_utt_brief_name()
{
    int need_slash = 2;
    int i;

    if (cur_ctl_path && strlen(cur_ctl_path) > 0) {
	i = strlen(cur_ctl_path);
	do {
	    if (cur_ctl_path[--i] == '/')
		--need_slash;
	} while ((i > 0) && need_slash);
	
	if (i == 0)
	    return cur_ctl_path;
	else
	    return &cur_ctl_path[i+1];
    }
    else
	return "N/A";
}